

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O0

bool Diligent::VerifyDrawAttribs(DrawAttribs *Attribs)

{
  undefined *puVar1;
  undefined8 uVar2;
  undefined1 local_60 [8];
  string _msg_1;
  undefined1 local_30 [8];
  string _msg;
  DrawAttribs *Attribs_local;
  
  _msg.field_2._8_8_ = Attribs;
  if (Attribs->NumVertices == 0) {
    FormatString<char[104]>
              ((string *)local_30,
               (char (*) [104])
               "DrawAttribs.NumVertices is 0. This is OK as the draw command will be ignored, but may be unintentional."
              );
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(0,uVar2,0);
    }
    std::__cxx11::string::~string((string *)local_30);
  }
  if (*(int *)(_msg.field_2._8_8_ + 8) == 0) {
    FormatString<char[105]>((string *)local_60,(char (*) [105])0x485ea9);
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(0,uVar2,0);
    }
    std::__cxx11::string::~string((string *)local_60);
  }
  return true;
}

Assistant:

bool VerifyDrawAttribs(const DrawAttribs& Attribs)
{
    if (Attribs.NumVertices == 0)
        LOG_INFO_MESSAGE("DrawAttribs.NumVertices is 0. This is OK as the draw command will be ignored, but may be unintentional.");
    if (Attribs.NumInstances == 0)
        LOG_INFO_MESSAGE("DrawAttribs.NumInstances is 0. This is OK as the draw command will be ignored, but may be unintentional.");

    return true;
}